

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.hh
# Opt level: O2

void __thiscall QPDFExc::~QPDFExc(QPDFExc *this)

{
  *(undefined ***)this = &PTR__QPDFExc_002aed98;
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)&this->object);
  std::__cxx11::string::~string((string *)&this->filename);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

~QPDFExc() noexcept override = default;